

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CSMLoader.cpp
# Opt level: O1

void __thiscall
Assimp::CSMImporter::InternReadFile
          (CSMImporter *this,string *pFile,aiScene *pScene,IOSystem *pIOHandler)

{
  undefined8 *puVar1;
  bool bVar2;
  IOStream *pIVar3;
  pointer __src;
  Assimp AVar4;
  int iVar5;
  undefined4 extraout_var;
  aiAnimation *paVar6;
  aiNodeAnim *paVar7;
  aiNodeAnim **__dest;
  aiVectorKey *paVar8;
  aiVectorKey *__dest_00;
  Logger *this_00;
  aiNode *paVar9;
  aiNode **ppaVar10;
  aiNode *this_01;
  aiAnimation **ppaVar11;
  long *plVar12;
  runtime_error *prVar13;
  undefined1 uVar14;
  undefined1 check_comma;
  uint uVar15;
  long lVar16;
  ulong uVar17;
  Assimp AVar18;
  aiNodeAnim *paVar19;
  ulong uVar20;
  uint uVar21;
  uint uVar22;
  _Alloc_hider _Var23;
  uint uVar24;
  Assimp *pAVar25;
  unique_ptr<aiAnimation,_std::default_delete<aiAnimation>_> anim;
  float d;
  vector<aiNodeAnim_*,_std::allocator<aiNodeAnim_*>_> anims_temp;
  vector<char,_std::allocator<char>_> mBuffer2;
  ulong local_108;
  uint local_fc;
  undefined1 local_f8 [24];
  pointer pFStack_e0;
  pointer local_c8;
  aiNodeAnim *local_a8;
  IOStream *local_a0;
  vector<aiNodeAnim_*,_std::allocator<aiNodeAnim_*>_> local_98;
  double local_80;
  aiNodeAnim *local_78;
  ulong local_70;
  aiNodeAnim *local_68;
  CSMImporter *local_60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  
  paVar7 = (aiNodeAnim *)(local_f8 + 0x10);
  local_f8._0_8_ = paVar7;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_f8,"rb","");
  iVar5 = (*pIOHandler->_vptr_IOSystem[4])(pIOHandler,(pFile->_M_dataplus)._M_p,local_f8._0_8_);
  local_a0 = (IOStream *)CONCAT44(extraout_var,iVar5);
  if ((aiNodeAnim *)local_f8._0_8_ != paVar7) {
    operator_delete((void *)local_f8._0_8_);
  }
  if (local_a0 == (IOStream *)0x0) {
    prVar13 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::operator+(&local_58,"Failed to open CSM file ",pFile);
    plVar12 = (long *)std::__cxx11::string::append((char *)&local_58);
    local_f8._0_8_ = *plVar12;
    paVar19 = (aiNodeAnim *)(plVar12 + 2);
    if ((aiNodeAnim *)local_f8._0_8_ == paVar19) {
      local_f8._16_8_ = *(undefined8 *)&paVar19->mNodeName;
      pFStack_e0 = (pointer)plVar12[3];
      local_f8._0_8_ = paVar7;
    }
    else {
      local_f8._16_8_ = *(undefined8 *)&paVar19->mNodeName;
    }
    local_f8._8_8_ = plVar12[1];
    *plVar12 = (long)paVar19;
    plVar12[1] = 0;
    *(undefined1 *)(plVar12 + 2) = 0;
    std::runtime_error::runtime_error(prVar13,(string *)local_f8);
    *(undefined ***)prVar13 = &PTR__runtime_error_00900168;
    __cxa_throw(prVar13,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
  }
  local_58._M_dataplus._M_p = (pointer)0x0;
  local_58._M_string_length = 0;
  local_58.field_2._M_allocated_capacity = 0;
  BaseImporter::TextFileToBuffer
            (local_a0,(vector<char,_std::allocator<char>_> *)&local_58,FORBID_EMPTY);
  _Var23._M_p = local_58._M_dataplus._M_p;
  local_60 = this;
  paVar6 = (aiAnimation *)operator_new(0x448);
  (paVar6->mName).length = 0;
  (paVar6->mName).data[0] = '\0';
  memset((paVar6->mName).data + 1,0x1b,0x3ff);
  paVar6->mDuration = -1.0;
  paVar6->mTicksPerSecond = 0.0;
  paVar6->mNumChannels = 0;
  paVar6->mChannels = (aiNodeAnim **)0x0;
  paVar6->mNumMeshChannels = 0;
  paVar6->mMeshChannels = (aiMeshAnim **)0x0;
  paVar6->mNumMorphMeshChannels = 0;
  paVar6->mMorphMeshChannels = (aiMeshMorphAnim **)0x0;
  uVar21 = 0xffffff;
  uVar22 = 0;
LAB_0041c1ae:
  AVar4 = (Assimp)0x1;
  pAVar25 = (Assimp *)_Var23._M_p;
LAB_0041c1b6:
  AVar18 = *pAVar25;
  _Var23._M_p = (pointer)pAVar25;
  if ((byte)AVar18 < 0x20) {
    if (AVar18 != (Assimp)0x9) goto LAB_0041c1d0;
  }
  else if (AVar18 != (Assimp)0x20) {
    if (AVar18 != (Assimp)0x24) goto LAB_0041c202;
    _Var23._M_p = (pointer)(pAVar25 + 1);
    iVar5 = strncasecmp("firstframe",_Var23._M_p,10);
    if ((iVar5 == 0) && ((ulong)(byte)pAVar25[0xb] < 0x21)) {
      AVar18 = (Assimp)0x1;
      AVar4 = (Assimp)0x1;
      if ((0x100003601U >> ((ulong)(byte)pAVar25[0xb] & 0x3f) & 1) == 0) goto LAB_0041c1fb;
      _Var23._M_p = (pointer)(pAVar25 + 0xc);
      bVar2 = true;
    }
    else {
LAB_0041c1fb:
      AVar18 = AVar4;
      bVar2 = false;
    }
    if (bVar2) goto LAB_0041c24f;
    iVar5 = strncasecmp("lastframe",_Var23._M_p,9);
    if (iVar5 == 0) {
      AVar18 = ((Assimp *)_Var23._M_p)[9];
      bVar2 = false;
      if (((ulong)(byte)AVar18 < 0x21) && ((0x100003601U >> ((ulong)(byte)AVar18 & 0x3f) & 1) != 0))
      {
        _Var23._M_p = _Var23._M_p + 10;
        bVar2 = true;
      }
    }
    else {
      bVar2 = false;
    }
    if (bVar2) goto LAB_0041c2f1;
    iVar5 = strncasecmp("rate",_Var23._M_p,4);
    if (iVar5 == 0) {
      AVar18 = ((Assimp *)_Var23._M_p)[4];
      bVar2 = false;
      if (((ulong)(byte)AVar18 < 0x21) && ((0x100003601U >> ((ulong)(byte)AVar18 & 0x3f) & 1) != 0))
      {
        _Var23._M_p = _Var23._M_p + 5;
        bVar2 = true;
      }
    }
    else {
      bVar2 = false;
    }
    if (bVar2) goto LAB_0041c390;
    iVar5 = strncasecmp("order",_Var23._M_p,5);
    if (iVar5 == 0) {
      bVar2 = false;
      if (((ulong)(byte)((Assimp *)_Var23._M_p)[5] < 0x21) &&
         ((0x100003601U >> ((ulong)(byte)((Assimp *)_Var23._M_p)[5] & 0x3f) & 1) != 0)) {
        _Var23._M_p = _Var23._M_p + 6;
        bVar2 = true;
      }
    }
    else {
      bVar2 = false;
    }
    if (bVar2) {
      local_98.super__Vector_base<aiNodeAnim_*,_std::allocator<aiNodeAnim_*>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      local_98.super__Vector_base<aiNodeAnim_*,_std::allocator<aiNodeAnim_*>_>._M_impl.
      super__Vector_impl_data._M_finish = (aiNodeAnim **)0x0;
      local_98.super__Vector_base<aiNodeAnim_*,_std::allocator<aiNodeAnim_*>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (aiNodeAnim **)0x0;
      std::vector<aiNodeAnim_*,_std::allocator<aiNodeAnim_*>_>::reserve(&local_98,0x1e);
      goto LAB_0041c44b;
    }
    iVar5 = strncasecmp("points",_Var23._M_p,6);
    if (iVar5 == 0) {
      bVar2 = false;
      if (((ulong)(byte)((Assimp *)_Var23._M_p)[6] < 0x21) &&
         ((0x100003601U >> ((ulong)(byte)((Assimp *)_Var23._M_p)[6] & 0x3f) & 1) != 0)) {
        _Var23._M_p = _Var23._M_p + 7;
        bVar2 = true;
      }
    }
    else {
      bVar2 = false;
    }
    if (!bVar2) goto LAB_0041c1ae;
    if (paVar6->mNumChannels == 0) {
      prVar13 = (runtime_error *)__cxa_allocate_exception(0x10);
      local_f8._0_8_ = local_f8 + 0x10;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_f8,
                 "CSM: \'$order\' section is required to appear prior to \'$points\'","");
      std::runtime_error::runtime_error(prVar13,(string *)local_f8);
      *(undefined ***)prVar13 = &PTR__runtime_error_00900168;
      __cxa_throw(prVar13,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
    }
    local_108 = 100;
    if (uVar21 != 0xffffff) {
      uVar15 = (uVar21 - uVar22 >> 2) + (uVar21 - uVar22);
      local_108 = (ulong)uVar15;
      if (paVar6->mNumChannels != 0) {
        uVar20 = 0;
        do {
          paVar8 = (aiVectorKey *)operator_new__(local_108 * 0x18);
          if (uVar15 != 0) {
            uVar17 = 0;
            do {
              puVar1 = (undefined8 *)((long)&paVar8->mTime + uVar17);
              *puVar1 = 0;
              puVar1[1] = 0;
              *(undefined4 *)((long)&(paVar8->mValue).z + uVar17) = 0;
              uVar17 = uVar17 + 0x18;
            } while (local_108 * 0x18 != uVar17);
          }
          paVar6->mChannels[uVar20]->mPositionKeys = paVar8;
          uVar20 = uVar20 + 1;
        } while (uVar20 < paVar6->mNumChannels);
      }
    }
    local_fc = 0;
LAB_0041c6e3:
    do {
      uVar20 = (ulong)(byte)*_Var23._M_p;
      if (uVar20 < 0x21) {
        if ((0x100000200U >> (uVar20 & 0x3f) & 1) != 0) {
          _Var23._M_p = _Var23._M_p + 1;
          goto LAB_0041c6e3;
        }
        if ((0x3401UL >> (uVar20 & 0x3f) & 1) != 0) {
          for (; uVar20 = (ulong)(byte)*_Var23._M_p, uVar20 < 0x25; _Var23._M_p = _Var23._M_p + 1) {
            if ((0x100002600U >> (uVar20 & 0x3f) & 1) == 0) {
              if ((0x1000000001U >> (uVar20 & 0x3f) & 1) != 0) {
                if (paVar6->mNumChannels != 0) {
                  lVar16 = 0;
                  do {
                    if (paVar6->mChannels[lVar16]->mNumPositionKeys == 0) {
                      prVar13 = (runtime_error *)__cxa_allocate_exception(0x10);
                      local_f8._0_8_ = local_f8 + 0x10;
                      std::__cxx11::string::_M_construct<char_const*>
                                ((string *)local_f8,"CSM: Invalid marker track","");
                      std::runtime_error::runtime_error(prVar13,(string *)local_f8);
                      *(undefined ***)prVar13 = &PTR__runtime_error_00900168;
                      __cxa_throw(prVar13,&DeadlyImportError::typeinfo,
                                  std::runtime_error::~runtime_error);
                    }
                    lVar16 = lVar16 + 1;
                  } while (paVar6->mNumChannels != (uint)lVar16);
                }
                goto LAB_0041c1ae;
              }
              break;
            }
          }
        }
      }
      AVar4 = (Assimp)*_Var23._M_p;
      uVar22 = 0;
      if (0xf5 < (byte)((char)AVar4 - 0x3aU)) {
        uVar22 = 0;
        do {
          uVar22 = (uint)(byte)((char)AVar4 - 0x30) + uVar22 * 10;
          AVar4 = ((Assimp *)_Var23._M_p)[1];
          _Var23._M_p = _Var23._M_p + 1;
        } while (0xf5 < (byte)((char)AVar4 - 0x3aU));
      }
      if ((int)uVar21 < (int)uVar22) {
        uVar21 = uVar22;
      }
      uVar15 = (uint)local_108;
      if (paVar6->mNumChannels != 0) {
        local_70 = (ulong)(uVar15 * 2);
        uVar20 = local_70 * 0x18;
        paVar7 = (aiNodeAnim *)(local_108 * 0x18);
        local_80 = (double)(int)uVar22;
        paVar19 = (aiNodeAnim *)0x0;
        local_78 = paVar7;
        do {
          local_a8 = paVar6->mChannels[(long)paVar19];
          local_68 = paVar19;
          if (local_a8->mNumPositionKeys == uVar15) {
            paVar8 = local_a8->mPositionKeys;
            uVar24 = (uint)local_70;
            local_a8->mNumPositionKeys = uVar24;
            __dest_00 = (aiVectorKey *)operator_new__(uVar20);
            if (uVar24 != 0) {
              uVar17 = 0;
              do {
                puVar1 = (undefined8 *)((long)&__dest_00->mTime + uVar17);
                *puVar1 = 0;
                puVar1[1] = 0;
                *(undefined4 *)((long)&(__dest_00->mValue).z + uVar17) = 0;
                uVar17 = uVar17 + 0x18;
              } while (uVar20 != uVar17);
            }
            local_a8->mPositionKeys = __dest_00;
            paVar7 = local_a8;
            memcpy(__dest_00,paVar8,(size_t)local_78);
            if (paVar8 != (aiVectorKey *)0x0) {
              operator_delete__(paVar8);
            }
          }
          while( true ) {
            uVar14 = SUB81(paVar7,0);
            uVar17 = (ulong)(byte)*_Var23._M_p;
            if (0x20 < uVar17) break;
            if ((0x100002600U >> (uVar17 & 0x3f) & 1) == 0) {
              if (uVar17 == 0) {
                prVar13 = (runtime_error *)__cxa_allocate_exception(0x10);
                local_f8._0_8_ = local_f8 + 0x10;
                std::__cxx11::string::_M_construct<char_const*>
                          ((string *)local_f8,"CSM: Unexpected EOF occurred reading sample x coord",
                           "");
                std::runtime_error::runtime_error(prVar13,(string *)local_f8);
                *(undefined ***)prVar13 = &PTR__runtime_error_00900168;
                __cxa_throw(prVar13,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error)
                ;
              }
              break;
            }
            _Var23._M_p = _Var23._M_p + 1;
          }
          iVar5 = strncasecmp("DROPOUT",_Var23._M_p,7);
          if ((iVar5 == 0) && ((ulong)(byte)((Assimp *)_Var23._M_p)[7] < 0x21)) {
            check_comma = true;
            uVar14 = 1;
            if ((0x100003601U >> ((ulong)(byte)((Assimp *)_Var23._M_p)[7] & 0x3f) & 1) == 0)
            goto LAB_0041c89e;
            _Var23._M_p = _Var23._M_p + 8;
            bVar2 = true;
          }
          else {
LAB_0041c89e:
            check_comma = uVar14;
            bVar2 = false;
          }
          if (bVar2) {
            this_00 = DefaultLogger::get();
            Logger::warn(this_00,"CSM: Encountered invalid marker data (DROPOUT)");
          }
          else {
            paVar8 = local_a8->mPositionKeys;
            uVar24 = local_a8->mNumPositionKeys;
            paVar8[uVar24].mTime = local_80;
            pAVar25 = (Assimp *)
                      fast_atoreal_move<float>
                                ((Assimp *)_Var23._M_p,(char *)&paVar8[uVar24].mValue,(float *)0x1,
                                 (bool)check_comma);
            while( true ) {
              uVar17 = (ulong)(byte)*pAVar25;
              if (0x20 < uVar17) break;
              if ((0x100002600U >> (uVar17 & 0x3f) & 1) == 0) {
                if (uVar17 == 0) {
                  prVar13 = (runtime_error *)__cxa_allocate_exception(0x10);
                  local_f8._0_8_ = local_f8 + 0x10;
                  std::__cxx11::string::_M_construct<char_const*>
                            ((string *)local_f8,
                             "CSM: Unexpected EOF occurred reading sample y coord","");
                  std::runtime_error::runtime_error(prVar13,(string *)local_f8);
                  *(undefined ***)prVar13 = &PTR__runtime_error_00900168;
                  __cxa_throw(prVar13,&DeadlyImportError::typeinfo,
                              std::runtime_error::~runtime_error);
                }
                break;
              }
              pAVar25 = pAVar25 + 1;
            }
            pAVar25 = (Assimp *)
                      fast_atoreal_move<float>
                                (pAVar25,(char *)&paVar8[uVar24].mValue.y,(float *)0x1,
                                 (bool)*pAVar25);
            while( true ) {
              uVar17 = (ulong)(byte)*pAVar25;
              if (0x20 < uVar17) break;
              if ((0x100002600U >> (uVar17 & 0x3f) & 1) == 0) {
                if (uVar17 == 0) {
                  prVar13 = (runtime_error *)__cxa_allocate_exception(0x10);
                  local_f8._0_8_ = local_f8 + 0x10;
                  std::__cxx11::string::_M_construct<char_const*>
                            ((string *)local_f8,
                             "CSM: Unexpected EOF occurred reading sample z coord","");
                  std::runtime_error::runtime_error(prVar13,(string *)local_f8);
                  *(undefined ***)prVar13 = &PTR__runtime_error_00900168;
                  __cxa_throw(prVar13,&DeadlyImportError::typeinfo,
                              std::runtime_error::~runtime_error);
                }
                break;
              }
              pAVar25 = pAVar25 + 1;
            }
            _Var23._M_p = fast_atoreal_move<float>
                                    (pAVar25,(char *)&paVar8[uVar24].mValue.z,(float *)0x1,
                                     (bool)*pAVar25);
            local_a8->mNumPositionKeys = local_a8->mNumPositionKeys + 1;
          }
          paVar19 = (aiNodeAnim *)((long)&(local_68->mNodeName).length + 1);
          paVar7 = (aiNodeAnim *)(ulong)paVar6->mNumChannels;
        } while (paVar19 < paVar7);
      }
      local_108 = (ulong)(uVar15 << (local_fc == uVar15));
      local_fc = local_fc + 1;
    } while( true );
  }
  pAVar25 = pAVar25 + 1;
  goto LAB_0041c1b6;
LAB_0041c24f:
  for (; (AVar4 = (Assimp)*_Var23._M_p, AVar4 == (Assimp)0x20 || (AVar4 == (Assimp)0x9));
      _Var23._M_p = _Var23._M_p + 1) {
  }
  _Var23._M_p = _Var23._M_p + (((char)AVar4 - 0x2bU & 0xfd) == 0);
  AVar18 = (Assimp)*_Var23._M_p;
  uVar15 = 0;
  if (0xf5 < (byte)((char)AVar18 - 0x3aU)) {
    uVar15 = 0;
    do {
      uVar15 = (uint)(byte)((char)AVar18 - 0x30) + uVar15 * 10;
      AVar18 = ((Assimp *)_Var23._M_p)[1];
      _Var23._M_p = _Var23._M_p + 1;
    } while (0xf5 < (byte)((char)AVar18 - 0x3aU));
  }
  uVar22 = -uVar15;
  if (AVar4 != (Assimp)0x2d) {
    uVar22 = uVar15;
  }
  goto LAB_0041c1ae;
LAB_0041c2f1:
  for (; (AVar4 = (Assimp)*_Var23._M_p, AVar4 == (Assimp)0x20 || (AVar4 == (Assimp)0x9));
      _Var23._M_p = _Var23._M_p + 1) {
  }
  _Var23._M_p = _Var23._M_p + (((char)AVar4 - 0x2bU & 0xfd) == 0);
  AVar18 = (Assimp)*_Var23._M_p;
  uVar15 = 0;
  if (0xf5 < (byte)((char)AVar18 - 0x3aU)) {
    uVar15 = 0;
    do {
      uVar15 = (uint)(byte)((char)AVar18 - 0x30) + uVar15 * 10;
      AVar18 = ((Assimp *)_Var23._M_p)[1];
      _Var23._M_p = _Var23._M_p + 1;
    } while (0xf5 < (byte)((char)AVar18 - 0x3aU));
  }
  uVar21 = -uVar15;
  if (AVar4 != (Assimp)0x2d) {
    uVar21 = uVar15;
  }
  goto LAB_0041c1ae;
LAB_0041c390:
  for (; ((Assimp)*_Var23._M_p == (Assimp)0x20 || ((Assimp)*_Var23._M_p == (Assimp)0x9));
      _Var23._M_p = _Var23._M_p + 1) {
  }
  _Var23._M_p = fast_atoreal_move<float>(_Var23._M_p,local_f8,(float *)0x1,(bool)AVar18);
  paVar6->mTicksPerSecond = (double)(float)local_f8._0_4_;
  goto LAB_0041c1ae;
LAB_0041c44b:
  __src = local_98.super__Vector_base<aiNodeAnim_*,_std::allocator<aiNodeAnim_*>_>._M_impl.
          super__Vector_impl_data._M_start;
  uVar20 = (ulong)(byte)*_Var23._M_p;
  if (0x20 < uVar20) {
LAB_0041c498:
    paVar7 = (aiNodeAnim *)operator_new(0x438);
    (paVar7->mNodeName).length = 0;
    (paVar7->mNodeName).data[0] = '\0';
    memset((paVar7->mNodeName).data + 1,0x1b,0x3ff);
    paVar7->mRotationKeys = (aiQuatKey *)0x0;
    paVar7->mNumScalingKeys = 0;
    *(undefined8 *)&paVar7->mNumPositionKeys = 0;
    *(undefined8 *)((long)&paVar7->mPositionKeys + 4) = 0;
    paVar7->mScalingKeys = (aiVectorKey *)0x0;
    paVar7->mPreState = aiAnimBehaviour_DEFAULT;
    paVar7->mPostState = aiAnimBehaviour_DEFAULT;
    local_f8._0_8_ = paVar7;
    if (local_98.super__Vector_base<aiNodeAnim_*,_std::allocator<aiNodeAnim_*>_>._M_impl.
        super__Vector_impl_data._M_finish ==
        local_98.super__Vector_base<aiNodeAnim_*,_std::allocator<aiNodeAnim_*>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      std::vector<aiNodeAnim*,std::allocator<aiNodeAnim*>>::_M_realloc_insert<aiNodeAnim*>
                ((vector<aiNodeAnim*,std::allocator<aiNodeAnim*>> *)&local_98,
                 (iterator)
                 local_98.super__Vector_base<aiNodeAnim_*,_std::allocator<aiNodeAnim_*>_>._M_impl.
                 super__Vector_impl_data._M_finish,(aiNodeAnim **)local_f8);
    }
    else {
      *local_98.super__Vector_base<aiNodeAnim_*,_std::allocator<aiNodeAnim_*>_>._M_impl.
       super__Vector_impl_data._M_finish = paVar7;
      local_98.super__Vector_base<aiNodeAnim_*,_std::allocator<aiNodeAnim_*>_>._M_impl.
      super__Vector_impl_data._M_finish =
           local_98.super__Vector_base<aiNodeAnim_*,_std::allocator<aiNodeAnim_*>_>._M_impl.
           super__Vector_impl_data._M_finish + 1;
    }
    paVar7 = local_98.super__Vector_base<aiNodeAnim_*,_std::allocator<aiNodeAnim_*>_>._M_impl.
             super__Vector_impl_data._M_finish[-1];
    lVar16 = 0;
    while( true ) {
      AVar4 = ((Assimp *)_Var23._M_p)[lVar16];
      if (((ulong)(byte)AVar4 < 0x21) && ((0x100003601U >> ((ulong)(byte)AVar4 & 0x3f) & 1) != 0))
      break;
      *(Assimp *)((paVar7->mNodeName).data + lVar16) = AVar4;
      lVar16 = lVar16 + 1;
    }
    (paVar7->mNodeName).data[lVar16] = '\0';
    (paVar7->mNodeName).length = (ai_uint32)lVar16;
    _Var23._M_p = _Var23._M_p + lVar16;
    goto LAB_0041c44b;
  }
  if ((0x3401UL >> (uVar20 & 0x3f) & 1) != 0) {
    for (; uVar20 = (ulong)(byte)*_Var23._M_p, uVar20 < 0x25; _Var23._M_p = _Var23._M_p + 1) {
      if ((0x100002600U >> (uVar20 & 0x3f) & 1) == 0) {
        if (uVar20 == 0x24) {
          uVar15 = (uint)((ulong)((long)local_98.
                                        super__Vector_base<aiNodeAnim_*,_std::allocator<aiNodeAnim_*>_>
                                        ._M_impl.super__Vector_impl_data._M_finish -
                                 (long)local_98.
                                       super__Vector_base<aiNodeAnim_*,_std::allocator<aiNodeAnim_*>_>
                                       ._M_impl.super__Vector_impl_data._M_start) >> 3);
          paVar6->mNumChannels = uVar15;
          if (uVar15 == 0) {
            prVar13 = (runtime_error *)__cxa_allocate_exception(0x10);
            local_f8._0_8_ = local_f8 + 0x10;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)local_f8,"CSM: Empty $order section","");
            std::runtime_error::runtime_error(prVar13,(string *)local_f8);
            *(undefined ***)prVar13 = &PTR__runtime_error_00900168;
            __cxa_throw(prVar13,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
          }
          __dest = (aiNodeAnim **)
                   operator_new__((long)local_98.
                                        super__Vector_base<aiNodeAnim_*,_std::allocator<aiNodeAnim_*>_>
                                        ._M_impl.super__Vector_impl_data._M_finish -
                                  (long)local_98.
                                        super__Vector_base<aiNodeAnim_*,_std::allocator<aiNodeAnim_*>_>
                                        ._M_impl.super__Vector_impl_data._M_start & 0x7fffffff8);
          paVar6->mChannels = __dest;
          memcpy(__dest,__src,(ulong)paVar6->mNumChannels << 3);
          if (__src != (pointer)0x0) {
            operator_delete(__src);
          }
          goto LAB_0041c1ae;
        }
        break;
      }
    }
    goto LAB_0041c498;
  }
  if ((0x100000200U >> (uVar20 & 0x3f) & 1) == 0) goto LAB_0041c498;
  _Var23._M_p = _Var23._M_p + 1;
  goto LAB_0041c44b;
LAB_0041c1d0:
  if (AVar18 == (Assimp)0x0) {
    paVar6->mDuration = (double)(int)(uVar21 - ((int)uVar22 >> 0x1f & uVar22));
    paVar9 = (aiNode *)operator_new(0x478);
    aiNode::aiNode(paVar9);
    pScene->mRootNode = paVar9;
    (paVar9->mName).length = 0xe;
    builtin_strncpy((paVar9->mName).data,"$CSM_DummyRoot",0xf);
    paVar9->mNumChildren = paVar6->mNumChannels;
    ppaVar10 = (aiNode **)operator_new__((ulong)paVar6->mNumChannels << 3);
    paVar9->mChildren = ppaVar10;
    if (paVar6->mNumChannels != 0) {
      uVar20 = 0;
      do {
        paVar7 = paVar6->mChannels[uVar20];
        this_01 = (aiNode *)operator_new(0x478);
        aiNode::aiNode(this_01);
        pScene->mRootNode->mChildren[uVar20] = this_01;
        paVar9 = (aiNode *)paVar6->mChannels[uVar20];
        if (this_01 != paVar9) {
          uVar22 = (paVar9->mName).length;
          (this_01->mName).length = uVar22;
          memcpy((this_01->mName).data,(paVar9->mName).data,(ulong)uVar22);
          (this_01->mName).data[uVar22] = '\0';
        }
        this_01->mParent = pScene->mRootNode;
        paVar8 = paVar7->mPositionKeys;
        (this_01->mTransformation).a1 = 1.0;
        (this_01->mTransformation).a2 = 0.0;
        (this_01->mTransformation).a3 = 0.0;
        (this_01->mTransformation).a4 = 0.0;
        (this_01->mTransformation).b1 = 0.0;
        (this_01->mTransformation).b2 = 1.0;
        (this_01->mTransformation).b3 = 0.0;
        (this_01->mTransformation).b4 = 0.0;
        (this_01->mTransformation).c1 = 0.0;
        (this_01->mTransformation).c2 = 0.0;
        (this_01->mTransformation).c3 = 1.0;
        (this_01->mTransformation).c4 = 0.0;
        (this_01->mTransformation).d1 = 0.0;
        (this_01->mTransformation).d2 = 0.0;
        (this_01->mTransformation).d3 = 0.0;
        (this_01->mTransformation).d4 = 1.0;
        (this_01->mTransformation).a4 = (paVar8->mValue).x;
        (this_01->mTransformation).b4 = (paVar8->mValue).y;
        (this_01->mTransformation).c4 = (paVar8->mValue).z;
        uVar20 = uVar20 + 1;
      } while (uVar20 < paVar6->mNumChannels);
    }
    pScene->mNumAnimations = 1;
    ppaVar11 = (aiAnimation **)operator_new__(8);
    pIVar3 = local_a0;
    pScene->mAnimations = ppaVar11;
    (paVar6->mName).length = 0xf;
    builtin_strncpy((paVar6->mName).data,"$CSM_MasterAnim",0x10);
    *pScene->mAnimations = paVar6;
    *(byte *)&pScene->mFlags = (byte)pScene->mFlags | 1;
    if (local_60->noSkeletonMesh == false) {
      SkeletonMeshBuilder::SkeletonMeshBuilder
                ((SkeletonMeshBuilder *)local_f8,pScene,pScene->mRootNode,true);
      if (local_c8 != (pointer)0x0) {
        operator_delete(local_c8);
      }
      if (pFStack_e0 != (pointer)0x0) {
        operator_delete(pFStack_e0);
      }
      if ((aiNodeAnim *)local_f8._0_8_ != (aiNodeAnim *)0x0) {
        operator_delete((void *)local_f8._0_8_);
      }
    }
    if ((Assimp *)local_58._M_dataplus._M_p != (Assimp *)0x0) {
      operator_delete(local_58._M_dataplus._M_p);
    }
    (*pIVar3->_vptr_IOStream[1])(pIVar3);
    return;
  }
LAB_0041c202:
  while ((0xd < (byte)*_Var23._M_p || ((0x2401U >> ((byte)*_Var23._M_p & 0x1f) & 1) == 0))) {
    _Var23._M_p = (pointer)((Assimp *)_Var23._M_p + 1);
  }
  for (; ((Assimp)*_Var23._M_p == (Assimp)0xd || ((Assimp)*_Var23._M_p == (Assimp)0xa));
      _Var23._M_p = _Var23._M_p + 1) {
  }
  goto LAB_0041c1ae;
}

Assistant:

void CSMImporter::InternReadFile( const std::string& pFile,
    aiScene* pScene, IOSystem* pIOHandler)
{
    std::unique_ptr<IOStream> file( pIOHandler->Open( pFile, "rb"));

    // Check whether we can read from the file
    if( file.get() == NULL) {
        throw DeadlyImportError( "Failed to open CSM file " + pFile + ".");
    }

    // allocate storage and copy the contents of the file to a memory buffer
    std::vector<char> mBuffer2;
    TextFileToBuffer(file.get(),mBuffer2);
    const char* buffer = &mBuffer2[0];

    std::unique_ptr<aiAnimation> anim(new aiAnimation());
    int first = 0, last = 0x00ffffff;

    // now process the file and look out for '$' sections
    while (1)   {
        SkipSpaces(&buffer);
        if ('\0' == *buffer)
            break;

        if ('$'  == *buffer)    {
            ++buffer;
            if (TokenMatchI(buffer,"firstframe",10))    {
                SkipSpaces(&buffer);
                first = strtol10(buffer,&buffer);
            }
            else if (TokenMatchI(buffer,"lastframe",9))     {
                SkipSpaces(&buffer);
                last = strtol10(buffer,&buffer);
            }
            else if (TokenMatchI(buffer,"rate",4))  {
                SkipSpaces(&buffer);
                float d;
                buffer = fast_atoreal_move<float>(buffer,d);
                anim->mTicksPerSecond = d;
            }
            else if (TokenMatchI(buffer,"order",5)) {
                std::vector< aiNodeAnim* > anims_temp;
                anims_temp.reserve(30);
                while (1)   {
                    SkipSpaces(&buffer);
                    if (IsLineEnd(*buffer) && SkipSpacesAndLineEnd(&buffer) && *buffer == '$')
                        break; // next section

                    // Construct a new node animation channel and setup its name
                    anims_temp.push_back(new aiNodeAnim());
                    aiNodeAnim* nda = anims_temp.back();

                    char* ot = nda->mNodeName.data;
                    while (!IsSpaceOrNewLine(*buffer))
                        *ot++ = *buffer++;

                    *ot = '\0';
                    nda->mNodeName.length = (size_t)(ot-nda->mNodeName.data);
                }

                anim->mNumChannels = static_cast<unsigned int>(anims_temp.size());
                if (!anim->mNumChannels)
                    throw DeadlyImportError("CSM: Empty $order section");

                // copy over to the output animation
                anim->mChannels = new aiNodeAnim*[anim->mNumChannels];
                ::memcpy(anim->mChannels,&anims_temp[0],sizeof(aiNodeAnim*)*anim->mNumChannels);
            }
            else if (TokenMatchI(buffer,"points",6))    {
                if (!anim->mNumChannels)
                    throw DeadlyImportError("CSM: \'$order\' section is required to appear prior to \'$points\'");

                // If we know how many frames we'll read, we can preallocate some storage
                unsigned int alloc = 100;
                if (last != 0x00ffffff)
                {
                    alloc = last-first;
                    alloc += alloc>>2u; // + 25%
                    for (unsigned int i = 0; i < anim->mNumChannels;++i)
                        anim->mChannels[i]->mPositionKeys = new aiVectorKey[alloc];
                }

                unsigned int filled = 0;

                // Now read all point data.
                while (1)   {
                    SkipSpaces(&buffer);
                    if (IsLineEnd(*buffer) && (!SkipSpacesAndLineEnd(&buffer) || *buffer == '$'))   {
                        break; // next section
                    }

                    // read frame
                    const int frame = ::strtoul10(buffer,&buffer);
                    last  = std::max(frame,last);
                    first = std::min(frame,last);
                    for (unsigned int i = 0; i < anim->mNumChannels;++i)    {

                        aiNodeAnim* s = anim->mChannels[i];
                        if (s->mNumPositionKeys == alloc)   { /* need to reallocate? */

                            aiVectorKey* old = s->mPositionKeys;
                            s->mPositionKeys = new aiVectorKey[s->mNumPositionKeys = alloc*2];
                            ::memcpy(s->mPositionKeys,old,sizeof(aiVectorKey)*alloc);
                            delete[] old;
                        }

                        // read x,y,z
                        if(!SkipSpacesAndLineEnd(&buffer))
                            throw DeadlyImportError("CSM: Unexpected EOF occurred reading sample x coord");

                        if (TokenMatchI(buffer, "DROPOUT", 7))  {
                            // seems this is invalid marker data; at least the doc says it's possible
                            ASSIMP_LOG_WARN("CSM: Encountered invalid marker data (DROPOUT)");
                        }
                        else    {
                            aiVectorKey* sub = s->mPositionKeys + s->mNumPositionKeys;
                            sub->mTime = (double)frame;
                            buffer = fast_atoreal_move<float>(buffer, (float&)sub->mValue.x);

                            if(!SkipSpacesAndLineEnd(&buffer))
                                throw DeadlyImportError("CSM: Unexpected EOF occurred reading sample y coord");
                            buffer = fast_atoreal_move<float>(buffer, (float&)sub->mValue.y);

                            if(!SkipSpacesAndLineEnd(&buffer))
                                throw DeadlyImportError("CSM: Unexpected EOF occurred reading sample z coord");
                            buffer = fast_atoreal_move<float>(buffer, (float&)sub->mValue.z);

                            ++s->mNumPositionKeys;
                        }
                    }

                    // update allocation granularity
                    if (filled == alloc)
                        alloc *= 2;

                    ++filled;
                }
                // all channels must be complete in order to continue safely.
                for (unsigned int i = 0; i < anim->mNumChannels;++i)    {

                    if (!anim->mChannels[i]->mNumPositionKeys)
                        throw DeadlyImportError("CSM: Invalid marker track");
                }
            }
        }
        else    {
            // advance to the next line
            SkipLine(&buffer);
        }
    }

    // Setup a proper animation duration
    anim->mDuration = last - std::min( first, 0 );

    // build a dummy root node with the tiny markers as children
    pScene->mRootNode = new aiNode();
    pScene->mRootNode->mName.Set("$CSM_DummyRoot");

    pScene->mRootNode->mNumChildren = anim->mNumChannels;
    pScene->mRootNode->mChildren = new aiNode* [anim->mNumChannels];

    for (unsigned int i = 0; i < anim->mNumChannels;++i)    {
        aiNodeAnim* na = anim->mChannels[i];

        aiNode* nd  = pScene->mRootNode->mChildren[i] = new aiNode();
        nd->mName   = anim->mChannels[i]->mNodeName;
        nd->mParent = pScene->mRootNode;

        aiMatrix4x4::Translation(na->mPositionKeys[0].mValue, nd->mTransformation);
    }

    // Store the one and only animation in the scene
    pScene->mAnimations    = new aiAnimation*[pScene->mNumAnimations=1];
    anim->mName.Set("$CSM_MasterAnim");
    pScene->mAnimations[0] = anim.release();

    // mark the scene as incomplete and run SkeletonMeshBuilder on it
    pScene->mFlags |= AI_SCENE_FLAGS_INCOMPLETE;

    if (!noSkeletonMesh) {
        SkeletonMeshBuilder maker(pScene,pScene->mRootNode,true);
    }
}